

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.h
# Opt level: O0

ProString * __thiscall QMakeMetaInfo::first(QMakeMetaInfo *this,ProKey *v)

{
  bool bVar1;
  char *in_RDX;
  QMakeMetaInfo *in_RSI;
  ProString *in_RDI;
  QMap<ProKey,_ProStringList> *unaff_retaddr;
  ProString *in_stack_ffffffffffffffc8;
  ProString *pPVar2;
  ProString *key;
  
  pPVar2 = in_RDI;
  key = in_RDI;
  bVar1 = isEmpty(in_RSI,(ProKey *)in_RDI);
  if (bVar1) {
    ProString::ProString(in_RDI,in_RDX);
  }
  else {
    QMap<ProKey,_ProStringList>::operator[](unaff_retaddr,(ProKey *)key);
    QList<ProString>::first((QList<ProString> *)in_RDI);
    ProString::ProString(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pPVar2;
}

Assistant:

inline ProString QMakeMetaInfo::first(const ProKey &v)
{
#if defined(Q_CC_SUN) && (__SUNPRO_CC == 0x500) || defined(Q_CC_HP)
    // workaround for Sun WorkShop 5.0 bug fixed in Forte 6
    if (isEmpty(v))
        return ProString("");
    else
        return vars[v].first();
#else
    return isEmpty(v) ? ProString("") : vars[v].first();
#endif
}